

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrefixTools.cpp
# Opt level: O3

PrefixData *
getPackagePrefixData
          (PrefixData *__return_storage_ptr__,File *file,Point cursorPosition,
          TSNode_conflict packageNode)

{
  __return_storage_ptr__->type = None;
  Point::Point(&(__return_storage_ptr__->range).start);
  Point::Point(&(__return_storage_ptr__->range).end);
  (__return_storage_ptr__->value)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->value).field_2;
  (__return_storage_ptr__->value)._M_string_length = 0;
  (__return_storage_ptr__->value).field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

PrefixData getPackagePrefixData (File &file, Point cursorPosition, TSNode packageNode) {
    return {};
}